

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

void __thiscall cmDependsC::SetupTransforms(cmDependsC *this)

{
  string *psVar1;
  _Rb_tree_header *p_Var2;
  cmMakefile *this_00;
  pointer pbVar3;
  _Base_ptr p_Var4;
  string *tr;
  pointer xform_00;
  allocator<char> local_69;
  string xform;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transformRules;
  
  transformRules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  transformRules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  transformRules.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
            super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&xform,"CMAKE_INCLUDE_TRANSFORMS",&local_69);
  cmMakefile::GetDefExpandList(this_00,&xform,&transformRules,true);
  std::__cxx11::string::~string((string *)&xform);
  pbVar3 = transformRules.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (xform_00 = transformRules.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; xform_00 != pbVar3;
      xform_00 = xform_00 + 1) {
    ParseTransform(this,xform_00);
  }
  psVar1 = &this->IncludeRegexTransformString;
  std::__cxx11::string::assign((char *)psVar1);
  if ((this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&xform,"^([ \t]*[#%][ \t]*(include|import)[ \t]*)(",&local_69);
    p_Var2 = &(this->TransformRules)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var4 = (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var2; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::string::append((char *)&xform);
      std::__cxx11::string::append((string *)&xform);
    }
    std::__cxx11::string::append((char *)&xform);
    cmsys::RegularExpression::compile(&this->IncludeRegexTransform,xform._M_dataplus._M_p);
    std::__cxx11::string::append((string *)psVar1);
    for (p_Var4 = (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var2; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::append((string *)psVar1);
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::append((string *)psVar1);
    }
    std::__cxx11::string::~string((string *)&xform);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&transformRules);
  return;
}

Assistant:

void cmDependsC::SetupTransforms()
{
  // Get the transformation rules.
  std::vector<std::string> transformRules;
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  mf->GetDefExpandList("CMAKE_INCLUDE_TRANSFORMS", transformRules, true);
  for (std::string const& tr : transformRules) {
    this->ParseTransform(tr);
  }

  this->IncludeRegexTransformString = INCLUDE_REGEX_TRANSFORM_MARKER;
  if (!this->TransformRules.empty()) {
    // Construct the regular expression to match lines to be
    // transformed.
    std::string xform = "^([ \t]*[#%][ \t]*(include|import)[ \t]*)(";
    const char* sep = "";
    for (auto const& tr : this->TransformRules) {
      xform += sep;
      xform += tr.first;
      sep = "|";
    }
    xform += ")[ \t]*\\(([^),]*)\\)";
    this->IncludeRegexTransform.compile(xform);

    // Build a string that encodes all transformation rules and will
    // change when rules are changed.
    this->IncludeRegexTransformString += xform;
    for (auto const& tr : this->TransformRules) {
      this->IncludeRegexTransformString += " ";
      this->IncludeRegexTransformString += tr.first;
      this->IncludeRegexTransformString += "(%)=";
      this->IncludeRegexTransformString += tr.second;
    }
  }
}